

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Gia_Man_t *
Gia_GenQbfMiter(Gia_Man_t *p,int nFrames,int nLutNum,int nLutSize,char *pStr,int fVerbose)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vFlops;
  Vec_Int_t *vParLits;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  bVar1 = (byte)nLutSize & 0x1f;
  iVar7 = nLutNum << bVar1;
  vFlops = Gia_GenCollectFlopIndexes(pStr,nLutNum,nLutSize,p->nRegs);
  vParLits = Vec_IntAlloc(iVar7);
  if (nLutNum << bVar1 < 1) {
    iVar7 = 0;
  }
  for (iVar8 = 1; iVar8 - iVar7 != 1; iVar8 = iVar8 + 1) {
    iVar2 = 1;
    if (iVar8 != 1) {
      iVar2 = Abc_Var2Lit(iVar8,0);
    }
    Vec_IntPush(vParLits,iVar2);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    Gia_ManAppendCi(p_00);
  }
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar3;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar8 = Gia_ObjFanin0Copy(pGVar5);
      iVar2 = Gia_ObjFanin1Copy(pGVar5);
      uVar3 = Gia_ManHashAnd(p_00,iVar8,iVar2);
      pGVar5->Value = uVar3;
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjFanin0Copy(pGVar5);
    pGVar5->Value = uVar3;
  }
  p_01 = Gia_GenCreateMuxes(p,p_00,vFlops,nLutNum,nLutSize,vParLits,0);
  p_02 = Gia_GenCreateMuxes(p,p_00,vFlops,nLutNum,nLutSize,vParLits,1);
  iVar7 = Vec_IntEntry(p_01,0);
  iVar8 = Vec_IntEntry(p_02,0);
  iVar8 = Abc_LitNot(iVar8);
  iVar7 = Gia_ManHashAnd(p_00,iVar7,iVar8);
  iVar7 = Abc_LitNot(iVar7);
  iVar7 = Gia_ManHashAnd(p_00,iVar7,2);
  Gia_ManAppendCo(p_00,iVar7);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(vFlops);
  Vec_IntFree(vParLits);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * p, int nFrames, int nLutNum, int nLutSize, char * pStr, int fVerbose )
{
    Gia_Obj_t * pObj; 
    Gia_Man_t * pTemp, * pNew;
    int i, iMiter, nPars = nLutNum * (1 << nLutSize);
    Vec_Int_t * vLits0, * vLits1, * vParLits;
    Vec_Int_t * vFlops = Gia_GenCollectFlopIndexes( pStr, nLutNum, nLutSize, Gia_ManRegNum(p) );
    // collect parameter literals (data vars)
    vParLits = Vec_IntAlloc( nPars );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vParLits, i ? Abc_Var2Lit(i+1, 0) : 1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPars; i++ )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    vLits0 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 0 );
    vLits1 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 1 );
    // create miter output
    iMiter = Gia_ManHashAnd( pNew, Vec_IntEntry(vLits0, 0), Abc_LitNot(Vec_IntEntry(vLits1, 0)) );
    iMiter = Gia_ManHashAnd( pNew, Abc_LitNot(iMiter), Abc_Var2Lit(1, 0) );
    Gia_ManAppendCo( pNew, iMiter );
    // cleanup
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vFlops );
    Vec_IntFree( vParLits );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}